

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O3

void * bad_thread(void *voidargs)

{
  fdb_kvs_handle *iterator;
  fdb_status fVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined4 extraout_EDX;
  fdb_doc *doc;
  fdb_kvs_handle *pfVar4;
  fdb_kvs_handle *handle;
  undefined8 in_R8;
  undefined8 in_R9;
  timeval __test_begin;
  fdb_doc local_70;
  timeval local_20;
  
  handle = *(fdb_kvs_handle **)((long)voidargs + 8);
  iterator = *(fdb_kvs_handle **)((long)voidargs + 0x10);
  doc = (fdb_doc *)0x0;
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  local_70.key = &local_70;
  local_70.size_ondisk = 0;
  local_70.meta = (void *)0x0;
  local_70.metalen = 0;
  local_70.seqnum = 0;
  local_70.offset = 0;
  local_70.deleted = false;
  local_70._73_3_ = 0;
  local_70.flags = 0;
  uVar3 = 2;
  local_70.keylen = 2;
  local_70.bodylen = 2;
  local_70.body = local_70.key;
  if (iterator == (fdb_kvs_handle *)0x0) {
LAB_001076b5:
    doc = &local_70;
    pfVar4 = handle;
    fVar1 = fdb_set(handle,doc);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107761;
    doc = &local_70;
    pfVar4 = handle;
    fVar1 = fdb_del(handle,doc);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107766;
    doc = &local_70;
    pfVar4 = handle;
    fVar1 = fdb_get(handle,doc);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_0010776b;
    doc = &local_70;
    pfVar4 = handle;
    fVar1 = fdb_get_metaonly(handle,doc);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107770;
    doc = &local_70;
    pfVar4 = handle;
    fVar1 = fdb_get_byseq(handle,doc);
    if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107775;
    doc = &local_70;
    pfVar4 = handle;
    fVar1 = fdb_get_metaonly_byseq(handle,doc);
    if (fVar1 == FDB_RESULT_HANDLE_BUSY) {
      doc = &local_70;
      local_70.offset = 5000;
      fVar1 = fdb_get_byoffset(handle,doc);
      if (fVar1 == FDB_RESULT_HANDLE_BUSY) {
        return (void *)0x0;
      }
      goto LAB_0010777f;
    }
  }
  else {
    pfVar4 = iterator;
    fVar1 = fdb_iterator_next((fdb_iterator *)iterator);
    if (fVar1 == FDB_RESULT_HANDLE_BUSY) {
      pfVar4 = iterator;
      fVar1 = fdb_iterator_prev((fdb_iterator *)iterator);
      if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107752;
      pfVar4 = iterator;
      fVar1 = fdb_iterator_seek_to_min((fdb_iterator *)iterator);
      if (fVar1 != FDB_RESULT_HANDLE_BUSY) goto LAB_00107757;
      pfVar4 = iterator;
      fVar1 = fdb_iterator_seek_to_max((fdb_iterator *)iterator);
      if (fVar1 == FDB_RESULT_HANDLE_BUSY) {
        uVar3 = 0;
        fVar1 = fdb_iterator_seek((fdb_iterator *)iterator,local_70.key,local_70.keylen,'\0');
        if (fVar1 == FDB_RESULT_HANDLE_BUSY) {
          return (void *)0x0;
        }
        bad_thread();
        goto LAB_001076b5;
      }
    }
    else {
      bad_thread();
LAB_00107752:
      bad_thread();
LAB_00107757:
      bad_thread();
    }
    bad_thread();
LAB_00107761:
    bad_thread();
LAB_00107766:
    bad_thread();
LAB_0010776b:
    bad_thread();
LAB_00107770:
    bad_thread();
LAB_00107775:
    bad_thread();
  }
  handle = pfVar4;
  bad_thread();
LAB_0010777f:
  bad_thread();
  if (*(char *)&handle->kvs == '\x01') {
    bad_thread(handle);
  }
  pvVar2 = (void *)(*(code *)doc->metalen)(extraout_EDX,uVar3,in_R8,in_R9);
  return pvVar2;
}

Assistant:

void *bad_thread(void *voidargs) {
    struct shared_data *data = (struct shared_data *)voidargs;
    fdb_kvs_handle *db = data->db;
    fdb_iterator *itr = data->iterator;
    fdb_status s;
    fdb_doc doc;
    TEST_INIT();

    memset(&doc, 0, sizeof(fdb_doc));
    doc.key = &doc; // some non-null value
    doc.keylen = 2; // some non-zero value
    doc.body = &doc; // some non-null value
    doc.bodylen = 2; // some non-zero value

    if (!itr) {
        // since the parent thread is hung in the fdb_set callback
        // all the forestdb apis calls on the same handle must return failure
        s = fdb_set(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_del(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get_metaonly(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get_byseq(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get_metaonly_byseq(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        doc.offset = 5000; // some random non-zero value
        s = fdb_get_byoffset(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
    } else {
        s = fdb_iterator_next(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_prev(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_seek_to_min(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_seek_to_max(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_seek(itr, doc.key, doc.keylen, 0);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
    }

    return NULL;
}